

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_sound.cpp
# Opt level: O3

TArray<char,_char> __thiscall SoundDecoder::readAll(SoundDecoder *this)

{
  uint *puVar1;
  int iVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  uint amount;
  uint uVar4;
  long *in_RSI;
  uint uVar5;
  TArray<char,_char> TVar6;
  
  this->_vptr_SoundDecoder = (_func_int **)0x0;
  this[1]._vptr_SoundDecoder = (_func_int **)0x0;
  uVar4 = 0x8000;
  TArray<char,_char>::Grow((TArray<char,_char> *)this,0x8000);
  uVar5 = 0;
  while( true ) {
    *(uint *)((long)&this[1]._vptr_SoundDecoder + 4) = uVar4;
    iVar2 = (**(code **)(*in_RSI + 8))();
    if (iVar2 == 0) break;
    uVar5 = uVar5 + iVar2;
    uVar4 = uVar5 * 2;
    puVar1 = (uint *)((long)&this[1]._vptr_SoundDecoder + 4);
    amount = uVar4 - *puVar1;
    if (*puVar1 <= uVar4 && amount != 0) {
      TArray<char,_char>::Grow((TArray<char,_char> *)this,amount);
    }
  }
  puVar1 = (uint *)((long)&this[1]._vptr_SoundDecoder + 4);
  uVar4 = uVar5 - *puVar1;
  uVar3 = extraout_RDX;
  if (*puVar1 <= uVar5 && uVar4 != 0) {
    TArray<char,_char>::Grow((TArray<char,_char> *)this,uVar4);
    uVar3 = extraout_RDX_00;
  }
  *(uint *)((long)&this[1]._vptr_SoundDecoder + 4) = uVar5;
  TVar6.Most = (int)uVar3;
  TVar6.Count = (int)((ulong)uVar3 >> 0x20);
  TVar6.Array = (char *)this;
  return TVar6;
}

Assistant:

TArray<char> SoundDecoder::readAll()
{
    TArray<char> output;
    unsigned total = 0;
    unsigned got;

    output.Resize(total+32768);
    while((got=(unsigned)read(&output[total], output.Size()-total)) > 0)
    {
        total += got;
        output.Resize(total*2);
    }
    output.Resize(total);
    return output;
}